

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiskin.cpp
# Opt level: O2

bool parseArgs(int argn,char **argv,Parameters *params)

{
  bool bVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  char **ppcVar6;
  allocator local_91;
  string arg3;
  string arg4;
  string arg5;
  
  if (argn - 7U < 0xfffffffc) {
    return false;
  }
  uVar3 = atoi(argv[1]);
  uVar4 = atoi(argv[2]);
  if (argn == 6) {
    std::__cxx11::string::string((string *)&arg3,argv[3],(allocator *)&arg4);
    std::__cxx11::string::string((string *)&arg4,argv[4],(allocator *)&arg5);
    std::__cxx11::string::string((string *)&arg5,argv[5],&local_91);
    bVar2 = std::operator==(&arg3,"-s");
    if ((bVar2) && (bVar2 = std::operator==(&arg5,"-a"), bVar2)) {
      ppcVar6 = argv + 4;
    }
    else {
      bVar2 = std::operator==(&arg3,"-a");
      if ((!bVar2) || (bVar2 = std::operator==(&arg4,"-s"), !bVar2)) {
        std::__cxx11::string::~string((string *)&arg5);
        std::__cxx11::string::~string((string *)&arg4);
        goto LAB_00104837;
      }
      ppcVar6 = argv + 5;
    }
    iVar5 = atoi(*ppcVar6);
    std::__cxx11::string::~string((string *)&arg5);
    std::__cxx11::string::~string((string *)&arg4);
    std::__cxx11::string::~string((string *)&arg3);
    bVar2 = true;
  }
  else {
    if (argn == 5) {
      std::__cxx11::string::string((string *)&arg3,argv[3],(allocator *)&arg4);
      bVar2 = std::operator==(&arg3,"-s");
      if (!bVar2) {
LAB_00104837:
        std::__cxx11::string::~string((string *)&arg3);
        return false;
      }
      iVar5 = atoi(argv[4]);
      std::__cxx11::string::~string((string *)&arg3);
    }
    else {
      iVar5 = -1;
      if (argn == 4) {
        std::__cxx11::string::string((string *)&arg3,argv[3],(allocator *)&arg4);
        bVar1 = std::operator==(&arg3,"-a");
        std::__cxx11::string::~string((string *)&arg3);
        bVar2 = true;
        if (!bVar1) {
          return false;
        }
        goto LAB_001047f2;
      }
    }
    bVar2 = false;
  }
LAB_001047f2:
  if (uVar3 % uVar4 != 0) {
    std::operator<<((ostream *)&std::cerr,
                    "The length of vector must be multiple of number of processors!\n");
    return false;
  }
  (params->super__Tuple_impl<0UL,_unsigned_int,_unsigned_int,_int,_bool>).
  super__Head_base<0UL,_unsigned_int,_false>._M_head_impl = uVar3;
  (params->super__Tuple_impl<0UL,_unsigned_int,_unsigned_int,_int,_bool>).
  super__Tuple_impl<1UL,_unsigned_int,_int,_bool>.super__Head_base<1UL,_unsigned_int,_false>.
  _M_head_impl = uVar4;
  (params->super__Tuple_impl<0UL,_unsigned_int,_unsigned_int,_int,_bool>).
  super__Tuple_impl<1UL,_unsigned_int,_int,_bool>.super__Tuple_impl<2UL,_int,_bool>.
  super__Head_base<2UL,_int,_false>._M_head_impl = iVar5;
  (params->super__Tuple_impl<0UL,_unsigned_int,_unsigned_int,_int,_bool>).
  super__Tuple_impl<1UL,_unsigned_int,_int,_bool>.super__Tuple_impl<2UL,_int,_bool>.
  super__Tuple_impl<3UL,_bool>.super__Head_base<3UL,_bool,_false>._M_head_impl = bVar2;
  return true;
}

Assistant:

bool parseArgs (int argn, char **argv, Parameters &params) {
	if (argn < 3 || argn > 6) {
		return false;
	}

	try {
		uint n			= std::atoi (argv[1]);
		uint p			= std::atoi (argv[2]);
		int seed		= -1;
		bool affinity	= false;

		
		if (argn == 4) {
			std::string arg3	= argv[3];
			if (arg3 == "-a")
				affinity	= true;
			else
				return false;
		}
		else if (argn == 5) {
			std::string arg3	= argv[3];
			if (arg3 == "-s")
				seed	= std::atoi (argv[4]);
			else
				return false;
		}
		else if (argn == 6) {
			std::string arg3	= argv[3];
			std::string arg4	= argv[4];
			std::string arg5	= argv[5];

			if (arg3 == "-s" && arg5 == "-a") {
				seed		= std::atoi (argv[4]);
				affinity	= true;
			}
			else if (arg3 == "-a" && arg4 == "-s") {
				seed		= std::atoi (argv[5]);
				affinity	= true;
			}
			else
				return false;
		}

		if (n%p != 0) {
			std::cerr << "The length of vector must be multiple of number of processors!\n";
			return false;
		}

		params	= Parameters (n, p, seed, affinity);

		return true;
	} catch (...) {
		return false;
	}
}